

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_math_random(jit_State *J,RecordFFData *rd)

{
  IRRef1 IVar1;
  IRRef1 IVar2;
  TRef TVar3;
  TRef TVar4;
  GCobj *o;
  TRef tr2;
  TRef tr1;
  TRef one;
  TRef tr;
  GCudata *ud;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  o = (GCobj *)((J->fn->c).upvalue[0].u64 & 0x7fffffffffff);
  lj_ir_kgc(J,o,IRT_UDATA);
  TVar3 = lj_ir_kptr_(J,IR_KPTR,&(o->th).maxstack);
  TVar3 = lj_ir_call(J,IRCALL_lj_prng_u64d,(ulong)TVar3);
  TVar4 = lj_ir_knum_u64(J,0x3ff0000000000000);
  IVar1 = (IRRef1)TVar4;
  (J->fold).ins.field_0.ot = 0x2a0e;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
  (J->fold).ins.field_0.op2 = IVar1;
  tr1 = lj_opt_fold(J);
  if (*J->base != 0) {
    TVar3 = lj_ir_tonum(J,*J->base);
    IVar2 = (IRRef1)TVar3;
    if (J->base[1] == 0) {
      (J->fold).ins.field_0.ot = 0x2b0e;
      (J->fold).ins.field_0.op1 = (IRRef1)tr1;
      (J->fold).ins.field_0.op2 = IVar2;
      TVar3 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x340e;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = 0;
      TVar3 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x290e;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = IVar1;
      tr1 = lj_opt_fold(J);
    }
    else {
      TVar3 = lj_ir_tonum(J,J->base[1]);
      (J->fold).ins.field_0.ot = 0x2a0e;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = IVar2;
      TVar3 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x290e;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = IVar1;
      TVar3 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x2b0e;
      (J->fold).ins.field_0.op1 = (IRRef1)tr1;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
      TVar3 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x340e;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = 0;
      TVar3 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x290e;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = IVar2;
      tr1 = lj_opt_fold(J);
    }
  }
  *J->base = tr1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_math_random(jit_State *J, RecordFFData *rd)
{
  GCudata *ud = udataV(&J->fn->c.upvalue[0]);
  TRef tr, one;
  lj_ir_kgc(J, obj2gco(ud), IRT_UDATA);  /* Prevent collection. */
  tr = lj_ir_call(J, IRCALL_lj_prng_u64d, lj_ir_kptr(J, uddata(ud)));
  one = lj_ir_knum_one(J);
  tr = emitir(IRTN(IR_SUB), tr, one);
  if (J->base[0]) {
    TRef tr1 = lj_ir_tonum(J, J->base[0]);
    if (J->base[1]) {  /* d = floor(d*(r2-r1+1.0)) + r1 */
      TRef tr2 = lj_ir_tonum(J, J->base[1]);
      tr2 = emitir(IRTN(IR_SUB), tr2, tr1);
      tr2 = emitir(IRTN(IR_ADD), tr2, one);
      tr = emitir(IRTN(IR_MUL), tr, tr2);
      tr = emitir(IRTN(IR_FPMATH), tr, IRFPM_FLOOR);
      tr = emitir(IRTN(IR_ADD), tr, tr1);
    } else {  /* d = floor(d*r1) + 1.0 */
      tr = emitir(IRTN(IR_MUL), tr, tr1);
      tr = emitir(IRTN(IR_FPMATH), tr, IRFPM_FLOOR);
      tr = emitir(IRTN(IR_ADD), tr, one);
    }
  }
  J->base[0] = tr;
  UNUSED(rd);
}